

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O3

string * conv(string *__return_storage_ptr__,string *l,size_t i)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream ss;
  long local_198 [3];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  if (i < l->_M_string_length) {
    cVar1 = (l->_M_dataplus)._M_p[i];
    if (cVar1 != '\n') {
      if (cVar1 < ' ') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\\x",2);
        *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
             *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)local_198,(int)(l->_M_dataplus)._M_p[i]);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
        std::ios_base::~ios_base(local_128);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)l);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "\\n";
    pcVar2 = "";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "---";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string conv(std::string const &l,size_t i)
{
	if(i >= l.size()) {
		return "---";
	}
	if(l[i] == '\n')
		return "\\n";
	if(l[i] < 32) {
		std::ostringstream ss;
		ss <<"\\x" << std::hex << (int)(l[i]);
		return ss.str();
	}
	else {
		return l.substr(i,1);
	}
}